

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_983a7::PedestrianPlugIn::handleFunctionKeys(PedestrianPlugIn *this,int keyNumber)

{
  switch(keyNumber) {
  case 1:
    addPedestrianToCrowd(this);
    return;
  case 2:
    removePedestrianFromCrowd(this);
    return;
  case 3:
    nextPD(this);
    return;
  case 4:
    (anonymous_namespace)::gUseDirectedPathFollowing =
         (anonymous_namespace)::gUseDirectedPathFollowing ^ 1;
    return;
  case 5:
    (anonymous_namespace)::gWanderSwitch = (anonymous_namespace)::gWanderSwitch ^ 1;
  }
  return;
}

Assistant:

void handleFunctionKeys (int keyNumber)
    {
        switch (keyNumber)
        {
            case 1:  addPedestrianToCrowd ();                               break;
            case 2:  removePedestrianFromCrowd ();                          break;
            case 3:  nextPD ();                                             break;
            case 4: gUseDirectedPathFollowing = !gUseDirectedPathFollowing; break;
            case 5: gWanderSwitch = !gWanderSwitch;                         break;
        }
    }